

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_sort_tree.hpp
# Opt level: O2

RunElement __thiscall
duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>::
ReplayGames(MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL> *this,
           Games *losers,idx_t slot_idx,RunElement *insert_val)

{
  pair<unsigned_long,_unsigned_long> *ppVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  unsigned_long uVar5;
  ulong uVar6;
  ulong uVar7;
  RunElement RVar8;
  
  uVar3 = insert_val->first;
  uVar5 = insert_val->second;
  uVar6 = slot_idx + 0x1f;
  do {
    uVar4 = uVar6 - 1;
    uVar6 = uVar4 >> 1;
    ppVar1 = losers->_M_elems + uVar6;
    uVar2 = losers->_M_elems[uVar6].first;
    if (uVar2 < uVar3) {
      uVar7 = ppVar1->second;
LAB_015db562:
      ppVar1->first = uVar3;
      ppVar1->second = uVar5;
      uVar3 = uVar2;
      uVar5 = uVar7;
    }
    else if ((uVar2 <= uVar3) && (uVar7 = ppVar1->second, uVar7 < uVar5)) goto LAB_015db562;
    if (uVar4 < 2) {
      RVar8.second = uVar5;
      RVar8.first = uVar3;
      return RVar8;
    }
  } while( true );
}

Assistant:

RunElement ReplayGames(Games &losers, idx_t slot_idx, const RunElement &insert_val) {
		RunElement smallest = insert_val;
		//	Start at a fake level below
		auto idx = slot_idx + losers.size();
		do {
			// Parent index
			idx = (idx - 1) / 2;
			// swap if out of order
			if (cmp(losers[idx], smallest)) {
				std::swap(losers[idx], smallest);
			}
		} while (idx);

		return smallest;
	}